

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blkarray_list.c
# Opt level: O0

void blkarray_list_reset(blkarray_list_t *bl)

{
  int local_18;
  int local_14;
  int32 j;
  int32 i;
  blkarray_list_t *bl_local;
  
  for (local_14 = 0; local_14 < bl->cur_row; local_14 = local_14 + 1) {
    for (local_18 = 0; local_18 < bl->blksize; local_18 = local_18 + 1) {
      ckd_free(bl->ptr[local_14][local_18]);
    }
    ckd_free(bl->ptr[local_14]);
    bl->ptr[local_14] = (void **)0x0;
  }
  if (local_14 == bl->cur_row) {
    for (local_18 = 0; local_18 < bl->cur_row_free; local_18 = local_18 + 1) {
      ckd_free(bl->ptr[local_14][local_18]);
    }
    ckd_free(bl->ptr[local_14]);
    bl->ptr[local_14] = (void **)0x0;
  }
  bl->n_valid = 0;
  bl->cur_row = -1;
  bl->cur_row_free = bl->blksize;
  return;
}

Assistant:

void
blkarray_list_reset(blkarray_list_t * bl)
{
    int32 i, j;

    /* Free all the allocated elements as well as the blocks */
    for (i = 0; i < bl->cur_row; i++) {
        for (j = 0; j < bl->blksize; j++)
            ckd_free(bl->ptr[i][j]);

        ckd_free(bl->ptr[i]);
        bl->ptr[i] = NULL;
    }
    if (i == bl->cur_row) {     /* NEED THIS! (in case cur_row < 0) */
        for (j = 0; j < bl->cur_row_free; j++)
            ckd_free(bl->ptr[i][j]);

        ckd_free(bl->ptr[i]);
        bl->ptr[i] = NULL;
    }

    bl->n_valid = 0;
    bl->cur_row = -1;
    bl->cur_row_free = bl->blksize;
}